

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O0

void __thiscall Type::Type(Type *this,TypeType tot)

{
  _func_int **pp_Var1;
  undefined8 *puVar2;
  DDE_Type in_ESI;
  DataDepElement *in_RDI;
  Object *in_stack_ffffffffffffffe0;
  
  Object::Object(in_stack_ffffffffffffffe0);
  DataDepElement::DataDepElement(in_RDI,TYPE);
  in_RDI->_vptr_DataDepElement = (_func_int **)&PTR__Type_0017ab00;
  in_RDI[5].dde_type_ = in_ESI;
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  in_RDI[6]._vptr_DataDepElement = (_func_int **)0x0;
  in_RDI[7]._vptr_DataDepElement = (_func_int **)current_decl_id;
  *(undefined1 *)&in_RDI[6].dde_type_ = ATTR;
  in_RDI[7].dde_type_ = ATTR;
  in_RDI[7].in_traversal = false;
  *(undefined3 *)&in_RDI[7].field_0xd = 0;
  in_RDI[8]._vptr_DataDepElement = (_func_int **)default_value_var;
  *(undefined4 *)&in_RDI[0xb]._vptr_DataDepElement = 3;
  *(undefined1 *)&in_RDI[8].dde_type_ = ATTR;
  in_RDI[0xb].dde_type_ = ATTR;
  in_RDI[0xb].in_traversal = false;
  *(undefined3 *)&in_RDI[0xb].field_0xd = 0;
  in_RDI[0xc]._vptr_DataDepElement = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0xc].dde_type_ = ATTR;
  in_RDI[0x10]._vptr_DataDepElement = (_func_int **)0x0;
  in_RDI[0x10].dde_type_ = ATTR;
  in_RDI[0x10].in_traversal = false;
  *(undefined3 *)&in_RDI[0x10].field_0xd = 0;
  in_RDI[0x11]._vptr_DataDepElement = (_func_int **)0x0;
  in_RDI[0x12]._vptr_DataDepElement = (_func_int **)0x0;
  in_RDI[0x11].dde_type_ = ATTR;
  in_RDI[0x11].in_traversal = false;
  *(undefined3 *)&in_RDI[0x11].field_0xd = 0;
  *(undefined1 *)&in_RDI[0xf].dde_type_ = ATTR;
  *(byte *)((long)&in_RDI[0xf].dde_type_ + 2) = 0;
  *(byte *)((long)&in_RDI[0xf].dde_type_ + 1) = 0;
  pp_Var1 = (_func_int **)operator_new(0x18);
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  std::vector<Field_*,_std::allocator<Field_*>_>::vector
            ((vector<Field_*,_std::allocator<Field_*>_> *)0x14bef9);
  in_RDI[0xf]._vptr_DataDepElement = pp_Var1;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  std::vector<Attr_*,_std::allocator<Attr_*>_>::vector
            ((vector<Attr_*,_std::allocator<Attr_*>_> *)0x14bf33);
  *(undefined8 **)&in_RDI[0x12].dde_type_ = puVar2;
  in_RDI[0x13]._vptr_DataDepElement = (_func_int **)0x0;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  std::vector<Expr_*,_std::allocator<Expr_*>_>::vector
            ((vector<Expr_*,_std::allocator<Expr_*>_> *)0x14bf78);
  *(undefined8 **)&in_RDI[0x13].dde_type_ = puVar2;
  pp_Var1 = (_func_int **)operator_new(0x18);
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  std::vector<Expr_*,_std::allocator<Expr_*>_>::vector
            ((vector<Expr_*,_std::allocator<Expr_*>_> *)0x14bfb2);
  in_RDI[0x14]._vptr_DataDepElement = pp_Var1;
  *(undefined1 *)&in_RDI[0x14].dde_type_ = ATTR;
  *(byte *)((long)&in_RDI[0x14].dde_type_ + 1) = 0;
  in_RDI[0x15]._vptr_DataDepElement = (_func_int **)0x0;
  in_RDI[0x15].dde_type_ = ATTR;
  in_RDI[0x15].in_traversal = false;
  *(undefined3 *)&in_RDI[0x15].field_0xd = 0;
  in_RDI[0x16]._vptr_DataDepElement = (_func_int **)0x0;
  in_RDI[0x16].dde_type_ = ATTR;
  in_RDI[0x16].in_traversal = false;
  *(undefined3 *)&in_RDI[0x16].field_0xd = 0;
  in_RDI[0x17]._vptr_DataDepElement = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0x17].dde_type_ = ATTR;
  *(byte *)((long)&in_RDI[0x17].dde_type_ + 1) = 0;
  pp_Var1 = (_func_int **)operator_new(0x18);
  memset(pp_Var1,0,0x18);
  std::vector<Expr_*,_std::allocator<Expr_*>_>::vector
            ((vector<Expr_*,_std::allocator<Expr_*>_> *)0x14c042);
  in_RDI[0x18]._vptr_DataDepElement = pp_Var1;
  *(undefined1 *)&in_RDI[0x18].dde_type_ = ATTR;
  *(byte *)((long)&in_RDI[0x18].dde_type_ + 1) = 0;
  *(byte *)((long)&in_RDI[0x18].dde_type_ + 2) = 0;
  return;
}

Assistant:

Type::Type(TypeType tot) : DataDepElement(DataDepElement::TYPE), tot_(tot)
	{
	type_decl_ = nullptr;
	type_decl_id_ = current_decl_id;
	declared_as_type_ = false;
	env_ = nullptr;
	value_var_ = default_value_var;
	ASSERT(value_var_);
	value_var_type_ = MEMBER_VAR;
	anonymous_value_var_ = false;
	size_var_field_ = nullptr;
	size_expr_ = nullptr;
	boundary_checked_ = false;
	parsing_complete_var_field_ = nullptr;
	parsing_state_var_field_ = nullptr;
	buffering_state_var_field_ = nullptr;
	has_value_field_ = nullptr;

	array_until_input_ = nullptr;

	incremental_input_ = false;
	buffer_input_ = false;
	incremental_parsing_ = false;

	fields_ = new FieldList();

	attrs_ = new AttrList();
	attr_byteorder_expr_ = nullptr;
	attr_checks_ = new ExprList();
	attr_enforces_ = new ExprList();
	attr_chunked_ = false;
	attr_exportsourcedata_ = false;
	attr_if_expr_ = nullptr;
	attr_length_expr_ = nullptr;
	attr_letfields_ = nullptr;
	attr_multiline_end_ = nullptr;
	attr_linebreaker_ = nullptr;
	attr_oneline_ = false;
	attr_refcount_ = false;
	attr_requires_ = new ExprList();
	attr_restofdata_ = false;
	attr_restofflow_ = false;
	attr_transient_ = false;
	}